

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

bool __thiscall MultivariateTracker::update(MultivariateTracker *this,DataVector *data)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  long lVar8;
  double *pdVar9;
  reference pvVar10;
  pointer pDVar11;
  pointer this_00;
  double dVar12;
  double dVar13;
  __normal_iterator<StatisticsTracker_*,_std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>_>
  local_90;
  __normal_iterator<StatisticsTracker_*,_std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>_>
  local_88;
  iterator tracker;
  const_iterator datum;
  double dStack_70;
  int k;
  double local_68;
  double local_60;
  double N;
  double deltaJ;
  double meanJ;
  int countJ;
  int j;
  double deltaI;
  double meanI;
  int local_28;
  int countI;
  int i;
  int numPoints;
  DataVector *data_local;
  MultivariateTracker *this_local;
  
  _i = &data->super_vector<DataPoint,_std::allocator<DataPoint>_>;
  data_local = (DataVector *)this;
  sVar4 = std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::size
                    (&this->_statistics);
  if (sVar4 != 0) {
    sVar4 = std::vector<DataPoint,_std::allocator<DataPoint>_>::size(_i);
    sVar5 = std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::size
                      (&this->_statistics);
    if (sVar4 != sVar5) {
      return false;
    }
  }
  sVar4 = std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::size
                    (&this->_statistics);
  if (sVar4 == 0) {
    sVar4 = std::vector<DataPoint,_std::allocator<DataPoint>_>::size(_i);
    if (sVar4 == 0) {
      return false;
    }
    sVar4 = std::vector<DataPoint,_std::allocator<DataPoint>_>::size(_i);
    initialize(this,sVar4,&this->_options);
  }
  if (((this->_options).doCov & 1U) != 0) {
    sVar4 = std::vector<DataPoint,_std::allocator<DataPoint>_>::size(_i);
    countI = (int)sVar4;
    for (local_28 = 0; local_28 < countI; local_28 = local_28 + 1) {
      pvVar6 = std::vector<DataPoint,_std::allocator<DataPoint>_>::operator[](_i,(long)local_28);
      if ((pvVar6->active & 1U) != 0) {
        pvVar7 = std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::operator[]
                           (&this->_statistics,(long)local_28);
        lVar8 = StatisticsTracker::getCount(pvVar7);
        meanI._4_4_ = (int)lVar8;
        pvVar7 = std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::operator[]
                           (&this->_statistics,(long)local_28);
        deltaI = StatisticsTracker::getMean(pvVar7);
        pvVar6 = std::vector<DataPoint,_std::allocator<DataPoint>_>::operator[](_i,(long)local_28);
        _countJ = pvVar6->value - deltaI;
        for (meanJ._4_4_ = 0; meanJ._4_4_ < countI; meanJ._4_4_ = meanJ._4_4_ + 1) {
          pvVar6 = std::vector<DataPoint,_std::allocator<DataPoint>_>::operator[]
                             (_i,(long)meanJ._4_4_);
          if ((pvVar6->active & 1U) != 0) {
            pvVar7 = std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::operator[]
                               (&this->_statistics,(long)meanJ._4_4_);
            lVar8 = StatisticsTracker::getCount(pvVar7);
            meanJ._0_4_ = (int)lVar8;
            pvVar7 = std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::operator[]
                               (&this->_statistics,(long)meanJ._4_4_);
            deltaJ = StatisticsTracker::getMean(pvVar7);
            pvVar6 = std::vector<DataPoint,_std::allocator<DataPoint>_>::operator[]
                               (_i,(long)meanJ._4_4_);
            N = pvVar6->value - deltaJ;
            local_68 = (double)(meanI._4_4_ + 1);
            dStack_70 = (double)(meanJ._0_4_ + 1);
            pdVar9 = std::max<double>(&local_68,&stack0xffffffffffffff90);
            local_60 = *pdVar9;
            iVar3 = local_28 * countI + meanJ._4_4_;
            dVar12 = local_60 - 1.0;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&this->_covariance,(long)iVar3);
            dVar1 = N;
            *pvVar10 = dVar12 * *pvVar10;
            dVar13 = ((local_60 - 1.0) / local_60) * _countJ;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&this->_covariance,(long)iVar3);
            dVar12 = local_60;
            *pvVar10 = dVar13 * dVar1 + *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&this->_covariance,(long)iVar3);
            *pvVar10 = *pvVar10 / dVar12;
          }
        }
      }
    }
  }
  tracker._M_current =
       (StatisticsTracker *)std::vector<DataPoint,_std::allocator<DataPoint>_>::begin(_i);
  local_88._M_current =
       (StatisticsTracker *)
       std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::begin(&this->_statistics)
  ;
  while( true ) {
    local_90._M_current =
         (StatisticsTracker *)
         std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::end(&this->_statistics)
    ;
    bVar2 = __gnu_cxx::operator!=(&local_88,&local_90);
    if (!bVar2) break;
    pDVar11 = __gnu_cxx::
              __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>
              ::operator->((__normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>
                            *)&tracker);
    if ((pDVar11->active & 1U) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<StatisticsTracker_*,_std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>_>
                ::operator->(&local_88);
      pDVar11 = __gnu_cxx::
                __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>
                ::operator->((__normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>
                              *)&tracker);
      StatisticsTracker::update(this_00,pDVar11->value);
    }
    __gnu_cxx::
    __normal_iterator<StatisticsTracker_*,_std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>_>
    ::operator++(&local_88);
    __gnu_cxx::
    __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>::
    operator++((__normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>
                *)&tracker);
  }
  return true;
}

Assistant:

bool
    update(DataVector const & data)
    {

        // Check data dimensions matches tracker dimensions
        if (this->_statistics.size() != 0 && data.size() != this->_statistics.size())
        {
            return false;
        }

        // Try to initialize the tracker
        if (this->_statistics.size() == 0)
        {
            if (data.size() == 0) return false;
            this->initialize(data.size(), this->_options);
        }

        if (this->_options.doCov)
        {

            // Update covariance
            const int numPoints = data.size();
            for (int i = 0; i < numPoints; i++)
            {
            
                if (!data[i].active) continue;

                int countI = this->_statistics[i].getCount();
                double meanI = this->_statistics[i].getMean();
                double deltaI = (data[i].value - meanI);

                for (int j = 0; j < numPoints; j++)
                {

                    if (!data[j].active) continue;
                
                    int countJ = this->_statistics[j].getCount();
                    double meanJ = this->_statistics[j].getMean();
                    double deltaJ = (data[j].value - meanJ);

                    // Conservative estimate the number of data points
                    double N = std::max<double>(countI+1, countJ+1);

                    int k = i * numPoints + j;
                    this->_covariance[k] *= (N-1);
                    this->_covariance[k] += ((N-1)/N) * (deltaI) * (deltaJ);
                    this->_covariance[k] /= N;

                }
            }

        }

        // Update statistics with each data point
        DataVector::const_iterator datum = data.begin();
        std::vector<StatisticsTracker>::iterator tracker = this->_statistics.begin();
        for ( ; tracker != this->_statistics.end(); ++tracker, ++datum)
        {
            if (datum->active) tracker->update(datum->value);
        }

        return true;
        
    }